

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O1

void putbyte(ubyte byte,uint address)

{
  uint uVar1;
  undefined6 in_register_00000032;
  
  if ((short)address < 0) {
    uVar1 = (uint)CONCAT62(in_register_00000032,address);
    if ((uVar1 & 0xff00) == 0xfe00) {
      (*wsheila[(char)address])(byte);
      return;
    }
    if ((uVar1 + 0x100 & 0xffff) < 0xfd00) {
      printf("\nROM write attempt at %X",CONCAT62(in_register_00000032,address) & 0xffffffff);
      exit(1);
    }
  }
  else {
    if (ram_screen_start <= address) {
      (*screen_byte_P)(byte,address);
    }
    RAM[address] = byte;
  }
  return;
}

Assistant:

void putbyte(ubyte byte, uint address) {
    if (address < 0x8000) {
        if (address >= ram_screen_start)  // if screen RAM
            screen_byte_P(byte, address); // output screen data

        RAM[address] = byte;              // update RAM
    }

    else if ((address & 0xFF00) == 0xFE00) wsheila[(char) (address)](byte);

    else if ((address < 0xFC00) || (address > 0xFEFF)) {
        // Since this is an impossible situation, a crash probably has occured
        // therefore display error and exit
        printf("\nROM write attempt at %X", address);
        exit(1);
    }
}